

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::repeat_at_least::scan
          (region *__return_storage_ptr__,repeat_at_least *this,location *loc)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  element_type *peVar2;
  ulong uVar3;
  location first;
  region reg;
  location checkpoint;
  location local_120;
  region local_d8;
  location local_70;
  
  location::location(&local_120,loc);
  for (uVar3 = 0; uVar3 < this->length_; uVar3 = uVar3 + 1) {
    _Var1._M_head_impl =
         (this->other_).scanner_._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_d8,_Var1._M_head_impl,loc);
    if (local_d8.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      location::operator=(loc,&local_120);
      region::region(__return_storage_ptr__);
      region::~region(&local_d8);
      goto LAB_00306947;
    }
    region::~region(&local_d8);
  }
  do {
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
      region::region(__return_storage_ptr__,&local_120,loc);
LAB_00306947:
      location::~location(&local_120);
      return __return_storage_ptr__;
    }
    location::location(&local_70,loc);
    _Var1._M_head_impl =
         (this->other_).scanner_._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_d8,_Var1._M_head_impl,loc);
    if (local_d8.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      location::operator=(loc,&local_70);
      region::region(__return_storage_ptr__,&local_120,loc);
      region::~region(&local_d8);
      location::~location(&local_70);
      goto LAB_00306947;
    }
    region::~region(&local_d8);
    location::~location(&local_70);
  } while( true );
}

Assistant:

TOML11_INLINE region repeat_at_least::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    while( ! loc.eof())
    {
        const auto checkpoint = loc;
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = checkpoint;
            return region(first, loc);
        }
    }
    return region(first, loc);
}